

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O1

int spki_table_copy_except_socket(spki_table *src,spki_table *dst,rtr_socket *socket)

{
  uint8_t *puVar1;
  rtr_socket *prVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  tommy_list ptVar9;
  long in_FS_OFFSET;
  byte bVar10;
  spki_record record;
  spki_record local_b8;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&src->lock);
  ptVar9 = src->list;
  iVar6 = 0;
  do {
    if (ptVar9 == (tommy_list)0x0) break;
    puVar1 = (uint8_t *)ptVar9->data;
    local_b8.asn = *(uint32_t *)(puVar1 + 0x14);
    prVar2 = *(rtr_socket **)(puVar1 + 0x78);
    local_b8.ski._16_4_ = *(undefined4 *)(puVar1 + 0x10);
    local_b8.ski._0_8_ = *(undefined8 *)puVar1;
    local_b8.ski._8_8_ = *(undefined8 *)(puVar1 + 8);
    puVar7 = puVar1 + 0x18;
    puVar8 = local_b8.spki;
    local_b8.socket = prVar2;
    for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)puVar8 = *(undefined8 *)puVar7;
      puVar7 = puVar7 + (ulong)bVar10 * -0x10 + 8;
      puVar8 = puVar8 + ((ulong)bVar10 * -2 + 1) * 8;
    }
    local_b8.spki._88_2_ = *(undefined2 *)(puVar1 + 0x70);
    local_b8.spki[0x5a] = puVar1[0x72];
    if (prVar2 == socket) {
LAB_0010d31d:
      ptVar9 = ptVar9->next;
      bVar3 = true;
    }
    else {
      iVar4 = spki_table_add_entry(dst,&local_b8);
      if (iVar4 == 0) goto LAB_0010d31d;
      iVar6 = -1;
      bVar3 = false;
    }
  } while (bVar3);
  pthread_rwlock_unlock((pthread_rwlock_t *)&src->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_copy_except_socket(struct spki_table *src, struct spki_table *dst, struct rtr_socket *socket)
{
	tommy_node *current_node;
	int ret = SPKI_SUCCESS;

	pthread_rwlock_rdlock(&src->lock);
	current_node = tommy_list_head(&src->list);
	while (current_node) {
		struct key_entry *entry;
		struct spki_record record;

		entry = (struct key_entry *)current_node->data;
		key_entry_to_spki_record(entry, &record);

		if (entry->socket != socket) {
			if (spki_table_add_entry(dst, &record) != SPKI_SUCCESS) {
				ret = SPKI_ERROR;
				break;
			}
		}
		current_node = current_node->next;
	}

	pthread_rwlock_unlock(&src->lock);

	return ret;
}